

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::SimpleFormatter::formatAndAppend
          (SimpleFormatter *this,UnicodeString **values,int32_t valuesLength,UnicodeString *appendTo
          ,int32_t *offsets,int32_t offsetsLength,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *compiledPattern;
  int32_t offsetsLength_local;
  int32_t *offsets_local;
  UnicodeString *appendTo_local;
  int32_t valuesLength_local;
  UnicodeString **values_local;
  SimpleFormatter *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  this_local = (SimpleFormatter *)appendTo;
  if (UVar1 == '\0') {
    UVar1 = anon_unknown_0::isInvalidArray(values,valuesLength);
    if (((UVar1 == '\0') &&
        (UVar1 = anon_unknown_0::isInvalidArray(offsets,offsetsLength), UVar1 == '\0')) &&
       (iVar2 = getArgumentLimit(this), iVar2 <= valuesLength)) {
      compiledPattern = icu_63::UnicodeString::getBuffer(&this->compiledPattern);
      iVar2 = icu_63::UnicodeString::length(&this->compiledPattern);
      this_local = (SimpleFormatter *)
                   format(compiledPattern,iVar2,values,appendTo,(UnicodeString *)0x0,'\x01',offsets,
                          offsetsLength,errorCode);
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString& SimpleFormatter::formatAndAppend(
        const UnicodeString *const *values, int32_t valuesLength,
        UnicodeString &appendTo,
        int32_t *offsets, int32_t offsetsLength, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return appendTo;
    }
    if (isInvalidArray(values, valuesLength) || isInvalidArray(offsets, offsetsLength) ||
            valuesLength < getArgumentLimit()) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }
    return format(compiledPattern.getBuffer(), compiledPattern.length(), values,
                  appendTo, NULL, TRUE,
                  offsets, offsetsLength, errorCode);
}